

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_L_invmult_inplace_p(m2v *LU,int rank,m2v *X_inout,int *placements)

{
  int alpha;
  int rt;
  ulong uVar1;
  int r1;
  ulong uVar2;
  int j;
  ulong uVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)rank;
  if (rank < 1) {
    uVar1 = uVar2;
  }
  for (; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    rt = (int)uVar2;
    if (placements != (int *)0x0) {
      rt = placements[uVar2];
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      r1 = (int)uVar3;
      if (placements != (int *)0x0) {
        r1 = placements[uVar3];
      }
      alpha = m2v_get_el(LU,(int)uVar2,(int)uVar3);
      m2v_multadd_row(X_inout,r1,alpha,X_inout,rt);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_L_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply L^(-1) */
	for (int i = 0; i < rank; ++i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = 0; j < i; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
					MV_GEN_N(_get_el)(LU, i, j),
					X_inout, pi);
		}
	}
}